

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool __thiscall cmFileCopier::ReportMissing(cmFileCopier *this,char *fromFile)

{
  cmCommand *this_00;
  ostream *poVar1;
  string local_1c0;
  ostringstream local_190 [8];
  ostringstream e;
  char *fromFile_local;
  cmFileCopier *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,this->Name);
  poVar1 = std::operator<<(poVar1," cannot find \"");
  poVar1 = std::operator<<(poVar1,fromFile);
  std::operator<<(poVar1,"\".");
  this_00 = &this->FileCommand->super_cmCommand;
  std::__cxx11::ostringstream::str();
  cmCommand::SetError(this_00,&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return false;
}

Assistant:

virtual bool ReportMissing(const char* fromFile)
    {
    // The input file does not exist and installation is not optional.
    std::ostringstream e;
    e << this->Name << " cannot find \"" << fromFile << "\".";
    this->FileCommand->SetError(e.str());
    return false;
    }